

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackDebGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackDebGenerator *this,string *componentName)

{
  ComponentPackageMethod CVar1;
  pointer pcVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  string groupVar;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
  if (CVar1 == ONE_PACKAGE) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"ALL_COMPONENTS_IN_ONE","");
  }
  else if (CVar1 == ONE_PACKAGE_PER_COMPONENT) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (componentName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + componentName->_M_string_length);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_48,componentName);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x4cfdb0);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar5;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88.field_2._8_8_ = plVar3[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_88);
    if (pcVar4 == (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (componentName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + componentName->_M_string_length);
    }
    else {
      pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_88);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackDebGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  if (componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    return componentName;
  }

  if (componentPackageMethod == ONE_PACKAGE) {
    return std::string("ALL_COMPONENTS_IN_ONE");
  }
  // We have to find the name of the COMPONENT GROUP
  // the current COMPONENT belongs to.
  std::string groupVar =
    "CPACK_COMPONENT_" + cmSystemTools::UpperCase(componentName) + "_GROUP";
  if (nullptr != GetOption(groupVar)) {
    return std::string(GetOption(groupVar));
  }
  return componentName;
}